

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

void __thiscall
QHashPrivate::MultiNode<QString,QDBusConnectionPrivate::SignalHook>::
insertMulti<QDBusConnectionPrivate::SignalHook_const&>
          (MultiNode<QString,QDBusConnectionPrivate::SignalHook> *this,SignalHook *args)

{
  Data *pDVar1;
  Data *pDVar2;
  Data *pDVar3;
  Data *pDVar4;
  long lVar5;
  long *plVar6;
  
  plVar6 = (long *)operator_new(0xc0);
  pDVar1 = (args->service).d.d;
  *plVar6 = (long)pDVar1;
  plVar6[1] = (long)(args->service).d.ptr;
  plVar6[2] = (args->service).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar1 = (args->path).d.d;
  plVar6[3] = (long)pDVar1;
  plVar6[4] = (long)(args->path).d.ptr;
  plVar6[5] = (args->path).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar1 = (args->signature).d.d;
  plVar6[6] = (long)pDVar1;
  plVar6[7] = (long)(args->signature).d.ptr;
  plVar6[8] = (args->signature).d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(int *)(plVar6 + 10) = args->midx;
  plVar6[9] = (long)args->obj;
  pDVar2 = (args->params).d.d;
  plVar6[0xb] = (long)pDVar2;
  plVar6[0xc] = (long)(args->params).d.ptr;
  plVar6[0xd] = (args->params).d.size;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar3 = (args->argumentMatch).args.d.d;
  plVar6[0xe] = (long)pDVar3;
  plVar6[0xf] = (long)(args->argumentMatch).args.d.ptr;
  plVar6[0x10] = (args->argumentMatch).args.d.size;
  if (pDVar3 != (Data *)0x0) {
    LOCK();
    (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    UNLOCK();
  }
  pDVar1 = (args->argumentMatch).arg0namespace.d.d;
  plVar6[0x11] = (long)pDVar1;
  plVar6[0x12] = (long)(args->argumentMatch).arg0namespace.d.ptr;
  plVar6[0x13] = (args->argumentMatch).arg0namespace.d.size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pDVar4 = (args->matchRule).d.d;
  plVar6[0x14] = (long)pDVar4;
  plVar6[0x15] = (long)(args->matchRule).d.ptr;
  plVar6[0x16] = (args->matchRule).d.size;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  plVar6[0x17] = 0;
  lVar5 = *(long *)(this + 0x18);
  *(long **)(this + 0x18) = plVar6;
  plVar6[0x17] = lVar5;
  return;
}

Assistant:

void insertMulti(Args &&... args)
    {
        Chain *e = new Chain{ T(std::forward<Args>(args)...), nullptr };
        e->next = std::exchange(value, e);
    }